

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# share.c
# Opt level: O2

CURLSH * curl_share_init(void)

{
  int iVar1;
  byte *pbVar2;
  
  pbVar2 = (byte *)(*Curl_ccalloc)(1,0x70);
  if (pbVar2 != (byte *)0x0) {
    *pbVar2 = *pbVar2 | 2;
    iVar1 = Curl_mk_dnscache((curl_hash *)(pbVar2 + 0x20));
    if (iVar1 == 0) {
      return pbVar2;
    }
    (*Curl_cfree)(pbVar2);
  }
  return (CURLSH *)0x0;
}

Assistant:

CURLSH *
curl_share_init(void)
{
  struct Curl_share *share = calloc(1, sizeof(struct Curl_share));
  if(share) {
    share->specifier |= (1<<CURL_LOCK_DATA_SHARE);

    if(Curl_mk_dnscache(&share->hostcache)) {
      free(share);
      return NULL;
    }
  }

  return share;
}